

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

String __thiscall doctest::detail::getStreamResult(detail *this,ostream *in)

{
  char *local_30;
  char local_20 [16];
  
  std::__cxx11::stringbuf::str();
  String::String((String *)this,local_30);
  if (local_30 != local_20) {
    operator_delete(local_30);
  }
  return (String)(char *)this;
}

Assistant:

String getStreamResult(std::ostream* in) {
        return static_cast<std::ostringstream*>(in)->str().c_str();
    }